

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

void nng_http_del_header(nng_http *conn,char *key)

{
  char *key_local;
  nng_http *conn_local;
  
  nni_http_del_header(conn,key);
  return;
}

Assistant:

void
nng_http_del_header(nng_http *conn, const char *key)
{
#ifdef NNG_SUPP_HTTP
	nni_http_del_header(conn, key);
#else
	NNI_ARG_UNUSED(conn);
	NNI_ARG_UNUSED(key);
#endif
}